

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void RotationComp(sector_t_conflict *sec,int which,double dx,double dy,double *tdx,double *tdy)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double sa;
  double ca;
  DAngle an;
  double *tdy_local;
  double *tdx_local;
  double dy_local;
  double dx_local;
  int which_local;
  sector_t_conflict *sec_local;
  
  an.Degrees = (double)tdy;
  sector_t::GetAngle((sector_t *)&ca,(int)sec,SUB41(which,0));
  bVar1 = TAngle<double>::operator==((TAngle<double> *)&ca,0.0);
  if (bVar1) {
    *tdx = dx;
    *(double *)an.Degrees = dy;
  }
  else {
    dVar2 = TAngle<double>::Cos((TAngle<double> *)&ca);
    dVar3 = TAngle<double>::Sin((TAngle<double> *)&ca);
    *tdx = dx * -dVar2 - dy * -dVar3;
    *(double *)an.Degrees = dy * -dVar2 + dx * -dVar3;
  }
  return;
}

Assistant:

static void RotationComp(const sector_t *sec, int which, double dx, double dy, double &tdx, double &tdy)
{
	DAngle an = sec->GetAngle(which);
	if (an == 0)
	{
		tdx = dx;
		tdy = dy;
	}
	else
	{
		double ca = -an.Cos();
		double sa = -an.Sin();
		tdx = dx*ca - dy*sa;
		tdy = dy*ca + dx*sa;
	}
}